

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlChar * xmlSchemaGetProp(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,char *name)

{
  xmlChar *name_00;
  xmlChar *pxVar1;
  
  name_00 = xmlGetNoNsProp(node,(xmlChar *)name);
  if (name_00 == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlDictLookup(ctxt->dict,name_00,-1);
    (*xmlFree)(name_00);
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
xmlSchemaGetProp(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
                 const char *name)
{
    xmlChar *val;
    const xmlChar *ret;

    val = xmlGetNoNsProp(node, BAD_CAST name);
    if (val == NULL)
        return(NULL);
    ret = xmlDictLookup(ctxt->dict, val, -1);
    xmlFree(val);
    return(ret);
}